

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O2

void duckdb::ListHasAllFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  list_entry_t *plVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  anon_class_40_5_f837a59a fun;
  anon_class_40_5_f837a59a fun_00;
  anon_class_40_5_f837a59a fun_01;
  anon_class_40_5_f837a59a fun_02;
  anon_class_40_5_f837a59a fun_03;
  anon_class_40_5_f837a59a fun_04;
  anon_class_40_5_f837a59a fun_05;
  anon_class_40_5_f837a59a fun_06;
  anon_class_40_5_f837a59a fun_07;
  anon_class_40_5_f837a59a fun_08;
  anon_class_40_5_f837a59a fun_09;
  anon_class_40_5_f837a59a fun_10;
  bool bVar8;
  BoundFunctionExpression *pBVar9;
  reference vec;
  reference vec_00;
  LogicalType *pLVar10;
  idx_t iVar11;
  idx_t iVar12;
  Vector *this;
  Vector *this_00;
  idx_t iVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t i;
  uint64_t *puVar16;
  ValidityMask *this_01;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t i_2;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  LogicalType local_298;
  LogicalType local_280;
  string_t *probe_data;
  string_t *build_data;
  UnifiedVectorFormat local_258;
  UnifiedVectorFormat ldata;
  Vector r_sortkey_vec;
  Vector l_sortkey_vec;
  string_set_t set;
  UnifiedVectorFormat probe_format;
  UnifiedVectorFormat build_format;
  
  pBVar9 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  bVar8 = ::std::operator==(&(pBVar9->function).super_BaseScalarFunction.super_SimpleFunction.
                             super_Function.name,"<@");
  vec = vector<duckdb::Vector,_true>::get<true>(&args->data,(ulong)bVar8);
  vec_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,(ulong)!bVar8);
  pLVar10 = ListType::GetChildType(&vec->type);
  LogicalType::LogicalType((LogicalType *)&l_sortkey_vec,SQLNULL);
  bVar8 = LogicalType::operator==(pLVar10,(LogicalType *)&l_sortkey_vec);
  if (bVar8) {
    pLVar10 = ListType::GetChildType(&vec_00->type);
    LogicalType::LogicalType((LogicalType *)&r_sortkey_vec,SQLNULL);
    bVar8 = LogicalType::operator==(pLVar10,(LogicalType *)&r_sortkey_vec);
    LogicalType::~LogicalType((LogicalType *)&r_sortkey_vec);
    LogicalType::~LogicalType((LogicalType *)&l_sortkey_vec);
    if (bVar8) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      *result->data = '\x01';
      return;
    }
  }
  else {
    LogicalType::~LogicalType((LogicalType *)&l_sortkey_vec);
  }
  iVar11 = ListVector::GetListSize(vec);
  iVar12 = ListVector::GetListSize(vec_00);
  this = ListVector::GetEntry(vec);
  this_00 = ListVector::GetEntry(vec_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&build_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&probe_format);
  Vector::ToUnifiedFormat(this,iVar11,&build_format);
  Vector::ToUnifiedFormat(this_00,iVar12,&probe_format);
  LogicalType::LogicalType(&local_280,BLOB);
  Vector::Vector(&l_sortkey_vec,&local_280,iVar11);
  LogicalType::~LogicalType(&local_280);
  LogicalType::LogicalType(&local_298,BLOB);
  Vector::Vector(&r_sortkey_vec,&local_298,iVar12);
  LogicalType::~LogicalType(&local_298);
  CreateSortKeyHelpers::CreateSortKey(this,iVar11,(OrderModifiers)0x302,&l_sortkey_vec);
  CreateSortKeyHelpers::CreateSortKey(this_00,iVar12,(OrderModifiers)0x302,&r_sortkey_vec);
  build_data = (string_t *)l_sortkey_vec.data;
  probe_data = (string_t *)r_sortkey_vec.data;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar11 = args->count;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      fun.build_format = &build_format;
      fun.set = &set;
      fun.build_data = &build_data;
      fun.probe_format = &probe_format;
      fun.probe_data = &probe_data;
      bVar8 = BinaryLambdaWrapper::
              Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                        (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,in_R8,in_R9);
      *pdVar4 = bVar8;
      goto LAB_00cdce3b;
    }
  }
  else {
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar4 = vec->data;
      plVar5 = (list_entry_t *)vec_00->data;
      puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        FlatVector::SetValidity(result,&vec->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar16 = (uint64_t *)(pdVar4 + 8);
          for (iVar12 = 0; iVar11 != iVar12; iVar12 = iVar12 + 1) {
            fun_05.build_format = &build_format;
            fun_05.set = &set;
            fun_05.build_data = &build_data;
            fun_05.probe_format = &probe_format;
            fun_05.probe_data = &probe_data;
            left_02.length = *puVar16;
            left_02.offset = puVar16[-1];
            bVar8 = BinaryLambdaWrapper::
                    Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                              (fun_05,left_02,*plVar5,in_R8,in_R9);
            pdVar6[iVar12] = bVar8;
            puVar16 = puVar16 + 2;
          }
        }
        else {
          uVar22 = 0;
          for (uVar14 = 0; uVar14 != iVar11 + 0x3f >> 6; uVar14 = uVar14 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar17 = uVar22 + 0x40;
              if (iVar11 <= uVar22 + 0x40) {
                uVar17 = iVar11;
              }
LAB_00cdcd81:
              puVar16 = (uint64_t *)(pdVar4 + uVar22 * 0x10 + 8);
              for (uVar21 = uVar22; uVar21 < uVar17; uVar21 = uVar21 + 1) {
                fun_01.build_format = &build_format;
                fun_01.set = &set;
                fun_01.build_data = &build_data;
                fun_01.probe_format = &probe_format;
                fun_01.probe_data = &probe_data;
                left_00.length = *puVar16;
                left_00.offset = puVar16[-1];
                bVar8 = BinaryLambdaWrapper::
                        Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                  (fun_01,left_00,*plVar5,in_R8,in_R9);
                pdVar6[uVar21] = bVar8;
                puVar16 = puVar16 + 2;
              }
            }
            else {
              uVar20 = puVar3[uVar14];
              uVar17 = uVar22 + 0x40;
              if (iVar11 <= uVar22 + 0x40) {
                uVar17 = iVar11;
              }
              if (uVar20 == 0xffffffffffffffff) goto LAB_00cdcd81;
              uVar21 = uVar17;
              if (uVar20 != 0) {
                puVar16 = (uint64_t *)(pdVar4 + uVar22 * 0x10 + 8);
                uVar18 = 0;
                for (uVar21 = uVar22; uVar21 < uVar17; uVar21 = uVar21 + 1) {
                  if ((uVar20 >> (uVar18 & 0x3f) & 1) != 0) {
                    fun_00.build_format = &build_format;
                    fun_00.set = &set;
                    fun_00.build_data = &build_data;
                    fun_00.probe_format = &probe_format;
                    fun_00.probe_data = &probe_data;
                    left.length = *puVar16;
                    left.offset = puVar16[-1];
                    bVar8 = BinaryLambdaWrapper::
                            Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                      (fun_00,left,*plVar5,in_R8,in_R9);
                    pdVar6[uVar21] = bVar8;
                  }
                  puVar16 = puVar16 + 2;
                  uVar18 = uVar18 + 1;
                }
              }
            }
            uVar22 = uVar21;
          }
        }
        goto LAB_00cdce3b;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar4 = vec->data;
          pdVar6 = vec_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vec);
          FlatVector::SetValidity(result,&vec->validity);
          FlatVector::VerifyFlatVector(vec_00);
          this_01 = &result->validity;
          ValidityMask::Combine(this_01,&vec_00->validity,iVar11);
          if ((this_01->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            lVar23 = 8;
            for (iVar12 = 0; iVar11 != iVar12; iVar12 = iVar12 + 1) {
              fun_10.build_format = &build_format;
              fun_10.set = &set;
              fun_10.build_data = &build_data;
              fun_10.probe_format = &probe_format;
              fun_10.probe_data = &probe_data;
              left_06.length = *(uint64_t *)(pdVar4 + lVar23);
              left_06.offset = *(uint64_t *)(pdVar4 + lVar23 + -8);
              right_06.length = *(uint64_t *)(pdVar6 + lVar23);
              right_06.offset = *(uint64_t *)(pdVar6 + lVar23 + -8);
              bVar8 = BinaryLambdaWrapper::
                      Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                (fun_10,left_06,right_06,in_R8,in_R9);
              pdVar7[iVar12] = bVar8;
              lVar23 = lVar23 + 0x10;
            }
          }
          else {
            uVar22 = 0;
            for (uVar14 = 0; uVar14 != iVar11 + 0x3f >> 6; uVar14 = uVar14 + 1) {
              puVar3 = (this_01->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar17 = uVar22 + 0x40;
                if (iVar11 <= uVar22 + 0x40) {
                  uVar17 = iVar11;
                }
LAB_00cdd2d6:
                uVar20 = uVar22 << 4 | 8;
                for (uVar21 = uVar22; uVar21 < uVar17; uVar21 = uVar21 + 1) {
                  fun_07.build_format = &build_format;
                  fun_07.set = &set;
                  fun_07.build_data = &build_data;
                  fun_07.probe_format = &probe_format;
                  fun_07.probe_data = &probe_data;
                  left_04.length = *(uint64_t *)(pdVar4 + uVar20);
                  left_04.offset = *(uint64_t *)(pdVar4 + (uVar20 - 8));
                  right_03.length = *(uint64_t *)(pdVar6 + uVar20);
                  right_03.offset = *(uint64_t *)(pdVar6 + (uVar20 - 8));
                  bVar8 = BinaryLambdaWrapper::
                          Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                    (fun_07,left_04,right_03,in_R8,in_R9);
                  pdVar7[uVar21] = bVar8;
                  uVar20 = uVar20 + 0x10;
                }
              }
              else {
                uVar20 = puVar3[uVar14];
                uVar17 = uVar22 + 0x40;
                if (iVar11 <= uVar22 + 0x40) {
                  uVar17 = iVar11;
                }
                if (uVar20 == 0xffffffffffffffff) goto LAB_00cdd2d6;
                uVar21 = uVar17;
                if (uVar20 != 0) {
                  uVar19 = uVar22 << 4 | 8;
                  uVar18 = 0;
                  for (uVar21 = uVar22; uVar21 < uVar17; uVar21 = uVar21 + 1) {
                    if ((uVar20 >> (uVar18 & 0x3f) & 1) != 0) {
                      fun_06.build_format = &build_format;
                      fun_06.set = &set;
                      fun_06.build_data = &build_data;
                      fun_06.probe_format = &probe_format;
                      fun_06.probe_data = &probe_data;
                      left_03.length = *(uint64_t *)(pdVar4 + uVar19);
                      left_03.offset = *(uint64_t *)(pdVar4 + (uVar19 - 8));
                      right_02.length = *(uint64_t *)(pdVar6 + uVar19);
                      right_02.offset = *(uint64_t *)(pdVar6 + (uVar19 - 8));
                      bVar8 = BinaryLambdaWrapper::
                              Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                        (fun_06,left_03,right_02,in_R8,in_R9);
                      pdVar7[uVar21] = bVar8;
                    }
                    uVar19 = uVar19 + 0x10;
                    uVar18 = uVar18 + 1;
                  }
                }
              }
              uVar22 = uVar21;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_258);
          Vector::ToUnifiedFormat(vec,iVar11,&ldata);
          Vector::ToUnifiedFormat(vec_00,iVar11,&local_258);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar12 = 0; iVar11 != iVar12; iVar12 = iVar12 + 1) {
              iVar13 = iVar12;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar13 = (idx_t)(ldata.sel)->sel_vector[iVar12];
              }
              iVar15 = iVar12;
              if ((local_258.sel)->sel_vector != (sel_t *)0x0) {
                iVar15 = (idx_t)(local_258.sel)->sel_vector[iVar12];
              }
              fun_02.build_format = &build_format;
              fun_02.set = &set;
              fun_02.build_data = &build_data;
              fun_02.probe_format = &probe_format;
              fun_02.probe_data = &probe_data;
              left_01.length = *(uint64_t *)(ldata.data + iVar13 * 0x10 + 8);
              left_01.offset = *(uint64_t *)(ldata.data + iVar13 * 0x10);
              right.length = *(uint64_t *)(local_258.data + iVar15 * 0x10 + 8);
              right.offset = *(uint64_t *)(local_258.data + iVar15 * 0x10);
              bVar8 = BinaryLambdaWrapper::
                      Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                (fun_02,left_01,right,in_R8,in_R9);
              pdVar4[iVar12] = bVar8;
            }
          }
          else {
            for (iVar12 = 0; iVar11 != iVar12; iVar12 = iVar12 + 1) {
              iVar13 = iVar12;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar13 = (idx_t)(ldata.sel)->sel_vector[iVar12];
              }
              iVar15 = iVar12;
              if ((local_258.sel)->sel_vector != (sel_t *)0x0) {
                iVar15 = (idx_t)(local_258.sel)->sel_vector[iVar12];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar13 >> 6] >> (iVar13 & 0x3f) & 1) != 0)) &&
                 ((local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0)))) {
                fun_08.build_format = &build_format;
                fun_08.set = &set;
                fun_08.build_data = &build_data;
                fun_08.probe_format = &probe_format;
                fun_08.probe_data = &probe_data;
                left_05.length = *(uint64_t *)(ldata.data + iVar13 * 0x10 + 8);
                left_05.offset = *(uint64_t *)(ldata.data + iVar13 * 0x10);
                right_04.length = *(uint64_t *)(local_258.data + iVar15 * 0x10 + 8);
                right_04.offset = *(uint64_t *)(local_258.data + iVar15 * 0x10);
                bVar8 = BinaryLambdaWrapper::
                        Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                  (fun_08,left_05,right_04,in_R8,in_R9);
                pdVar4[iVar12] = bVar8;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_258);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_00cdce3b;
      }
      plVar5 = (list_entry_t *)vec->data;
      puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        FlatVector::SetValidity(result,&vec_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar16 = (uint64_t *)(pdVar4 + 8);
          for (iVar12 = 0; iVar11 != iVar12; iVar12 = iVar12 + 1) {
            fun_09.build_format = &build_format;
            fun_09.set = &set;
            fun_09.build_data = &build_data;
            fun_09.probe_format = &probe_format;
            fun_09.probe_data = &probe_data;
            right_05.length = *puVar16;
            right_05.offset = puVar16[-1];
            bVar8 = BinaryLambdaWrapper::
                    Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                              (fun_09,*plVar5,right_05,in_R8,in_R9);
            pdVar6[iVar12] = bVar8;
            puVar16 = puVar16 + 2;
          }
        }
        else {
          uVar22 = 0;
          for (uVar14 = 0; uVar14 != iVar11 + 0x3f >> 6; uVar14 = uVar14 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar17 = uVar22 + 0x40;
              if (iVar11 <= uVar22 + 0x40) {
                uVar17 = iVar11;
              }
LAB_00cdd0ad:
              puVar16 = (uint64_t *)(pdVar4 + uVar22 * 0x10 + 8);
              for (uVar21 = uVar22; uVar21 < uVar17; uVar21 = uVar21 + 1) {
                fun_04.build_format = &build_format;
                fun_04.set = &set;
                fun_04.build_data = &build_data;
                fun_04.probe_format = &probe_format;
                fun_04.probe_data = &probe_data;
                right_01.length = *puVar16;
                right_01.offset = puVar16[-1];
                bVar8 = BinaryLambdaWrapper::
                        Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                  (fun_04,*plVar5,right_01,in_R8,in_R9);
                pdVar6[uVar21] = bVar8;
                puVar16 = puVar16 + 2;
              }
            }
            else {
              uVar20 = puVar3[uVar14];
              uVar17 = uVar22 + 0x40;
              if (iVar11 <= uVar22 + 0x40) {
                uVar17 = iVar11;
              }
              if (uVar20 == 0xffffffffffffffff) goto LAB_00cdd0ad;
              uVar21 = uVar17;
              if (uVar20 != 0) {
                puVar16 = (uint64_t *)(pdVar4 + uVar22 * 0x10 + 8);
                uVar18 = 0;
                for (uVar21 = uVar22; uVar21 < uVar17; uVar21 = uVar21 + 1) {
                  if ((uVar20 >> (uVar18 & 0x3f) & 1) != 0) {
                    fun_03.build_format = &build_format;
                    fun_03.set = &set;
                    fun_03.build_data = &build_data;
                    fun_03.probe_format = &probe_format;
                    fun_03.probe_data = &probe_data;
                    right_00.length = *puVar16;
                    right_00.offset = puVar16[-1];
                    bVar8 = BinaryLambdaWrapper::
                            Operation<duckdb::ListHasAllFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                      (fun_03,*plVar5,right_00,in_R8,in_R9);
                    pdVar6[uVar21] = bVar8;
                  }
                  puVar16 = puVar16 + 2;
                  uVar18 = uVar18 + 1;
                }
              }
            }
            uVar22 = uVar21;
          }
        }
        goto LAB_00cdce3b;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_00cdce3b:
  ::std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  Vector::~Vector(&r_sortkey_vec);
  Vector::~Vector(&l_sortkey_vec);
  UnifiedVectorFormat::~UnifiedVectorFormat(&probe_format);
  UnifiedVectorFormat::~UnifiedVectorFormat(&build_format);
  return;
}

Assistant:

static void ListHasAllFunction(DataChunk &args, ExpressionState &state, Vector &result) {

	const auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto swap = func_expr.function.name == "<@";

	auto &l_vec = args.data[swap ? 1 : 0];
	auto &r_vec = args.data[swap ? 0 : 1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL &&
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = true;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat build_format;
	UnifiedVectorFormat probe_format;

	l_child.ToUnifiedFormat(l_size, build_format);
	r_child.ToUnifiedFormat(r_size, probe_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto build_data = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto probe_data = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &build_list, const list_entry_t &probe_list) {
		    // Short circuit if the probe list is empty
		    if (probe_list.length == 0) {
			    return true;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format.sel->get_index(idx);
			    if (build_format.validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }

		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format.sel->get_index(idx);
			    if (probe_format.validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) == set.end()) {
				    return false;
			    }
		    }
		    return true;
	    });
}